

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.cpp
# Opt level: O0

header_info *
anon_unknown.dwarf_6a1ff::sec_websocket_version
          (header_info *__return_storage_ptr__,header_info *hi,string *value)

{
  maybe<unsigned_int,_void> local_2c;
  anon_class_1_0_00000001 local_21;
  string *psStack_20;
  anon_class_1_0_00000001 str_to_num;
  string *value_local;
  header_info *hi_local;
  
  psStack_20 = value;
  sec_websocket_version::anon_class_1_0_00000001::operator()(&local_2c,&local_21,value);
  pstore::maybe<unsigned_int,_void>::operator=(&hi->websocket_version,&local_2c);
  pstore::maybe<unsigned_int,_void>::~maybe(&local_2c);
  pstore::http::header_info::header_info(__return_storage_ptr__,hi);
  return __return_storage_ptr__;
}

Assistant:

header_info sec_websocket_version (header_info hi, std::string const & value) {
        auto str_to_num = [] (std::string const & v) {
            auto pos = std::string::size_type{0};
            auto const last = v.length ();
            auto num = 0U;
            for (; pos < last && std::isdigit (static_cast<unsigned char> (v[pos])); ++pos) {
                if (num > std::numeric_limits<unsigned>::max () / 10U - 10U) {
                    break; // overflow.
                }
                PSTORE_ASSERT (v[pos] >= '0');
                num = num * 10U + static_cast<unsigned> (v[pos] - '0');
            }
            return pos == last ? pstore::just (num) : pstore::nothing<unsigned> ();
        };

        hi.websocket_version = str_to_num (value);
        return hi;
    }